

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listimagewindow.cc
# Opt level: O3

void __thiscall
bgui::ListImageWindow::add(ListImageWindow *this,ImageFloat *image,string *s,bool copy)

{
  pointer *pppIVar1;
  iterator __position;
  Image<float,_gimage::PixelTraits<float>_> *this_00;
  ImageAdapter<float> *this_01;
  undefined7 in_register_00000009;
  ImageAdapterBase *adapt;
  int h;
  ostringstream out;
  ImageAdapter<float> *local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  int local_1a0 [28];
  ios_base local_130 [264];
  
  if ((int)CONCAT71(in_register_00000009,copy) != 0) {
    this_00 = (Image<float,_gimage::PixelTraits<float>_> *)operator_new(0x38);
    this_00->depth = 0;
    this_00->width = 0;
    this_00->height = 0;
    this_00->n = 0;
    this_00->pixel = (float *)0x0;
    this_00->row = (float **)0x0;
    this_00->img = (float ***)0x0;
    gimage::Image<float,_gimage::PixelTraits<float>_>::setSize
              (this_00,image->width,image->height,(long)image->depth);
    memcpy(this_00->pixel,image->pixel,this_00->n << 2);
    image = this_00;
  }
  this_01 = (ImageAdapter<float> *)operator_new(0xa8);
  ImageAdapter<float>::ImageAdapter(this_01,image,this->vmin,this->vmax,copy);
  __position._M_current =
       (this->list).
       super__Vector_base<bgui::ImageAdapterBase_*,_std::allocator<bgui::ImageAdapterBase_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_1c8 = this_01;
  if (__position._M_current ==
      (this->list).
      super__Vector_base<bgui::ImageAdapterBase_*,_std::allocator<bgui::ImageAdapterBase_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<bgui::ImageAdapterBase*,std::allocator<bgui::ImageAdapterBase*>>::
    _M_realloc_insert<bgui::ImageAdapterBase*const&>
              ((vector<bgui::ImageAdapterBase*,std::allocator<bgui::ImageAdapterBase*>> *)
               &this->list,__position,(ImageAdapterBase **)&local_1c8);
  }
  else {
    *__position._M_current = (ImageAdapterBase *)this_01;
    pppIVar1 = &(this->list).
                super__Vector_base<bgui::ImageAdapterBase_*,_std::allocator<bgui::ImageAdapterBase_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
  }
  if (s->_M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Image ",6);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
    std::__cxx11::stringbuf::str();
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->name,
               &local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1c0._M_dataplus._M_p._4_4_,(int)local_1c0._M_dataplus._M_p) !=
        &local_1c0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_1c0._M_dataplus._M_p._4_4_,(int)local_1c0._M_dataplus._M_p));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base(local_130);
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->name,s);
  }
  if ((long)(this->list).
            super__Vector_base<bgui::ImageAdapterBase_*,_std::allocator<bgui::ImageAdapterBase_*>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(this->list).
            super__Vector_base<bgui::ImageAdapterBase_*,_std::allocator<bgui::ImageAdapterBase_*>_>.
            _M_impl.super__Vector_impl_data._M_start == 8) {
    BaseWindow::getDisplaySize((BaseWindow *)this,local_1a0,(int *)&local_1c0);
    this->current = 0;
    set(this,0,local_1a0[0],(int)local_1c0._M_dataplus._M_p,true);
    BaseWindow::setVisible((BaseWindow *)this,true);
  }
  return;
}

Assistant:

void ListImageWindow::add(const gimage::ImageFloat &image, const std::string &s, bool copy)
{
  const gimage::ImageFloat *im=&image;

  if (copy)
  {
    im=new gimage::ImageFloat(image);
  }

  ImageAdapterBase *adapt=new ImageAdapter<float>(im, vmin, vmax, copy);

  list.push_back(adapt);

  if (s.size() == 0)
  {
    std::ostringstream out;

    out << "Image " << name.size();

    name.push_back(out.str());
  }
  else
  {
    name.push_back(s);
  }

  if (list.size() == 1)
  {
    int w, h;

    getDisplaySize(w, h);

    current=0;
    set(current, w, h, true);

    setVisible(true);
  }
}